

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Gia_Man_t * Gia_ManDupMuxesNoHash(Gia_Man_t *p)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *local_70;
  Gia_Obj_t *local_68;
  long local_60;
  Gia_Obj_t *local_58;
  long local_50;
  Gia_Man_t *local_48;
  uint local_3c;
  Gia_Obj_t *local_38;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0xe6,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  iVar5 = p->nObjs;
  if ((0 < iVar5) && (pGVar12 = p->pObjs, pGVar12 != (Gia_Obj_t *)0x0)) {
    lVar24 = 0;
    do {
      if (((~*(uint *)pGVar12 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar12) &&
         (iVar5 = Gia_ObjIsMuxType(pGVar12), iVar5 != 0)) {
        pGVar18 = pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff);
        pGVar11 = p->pObjs;
        if ((pGVar18 < pGVar11) || (pGVar11 + p->nObjs <= pGVar18)) goto LAB_007e20b9;
        piVar3 = p->pRefs;
        piVar1 = piVar3 + (int)((ulong)((long)pGVar18 - (long)pGVar11) >> 2) * -0x55555555;
        *piVar1 = *piVar1 + -1;
        pGVar12 = pGVar12 + -(ulong)(*(uint *)&pGVar12->field_0x4 & 0x1fffffff);
        if ((pGVar12 < pGVar11) || (pGVar11 + p->nObjs <= pGVar12)) goto LAB_007e20b9;
        piVar3 = piVar3 + (int)((ulong)((long)pGVar12 - (long)pGVar11) >> 2) * -0x55555555;
        *piVar3 = *piVar3 + -1;
      }
      lVar24 = lVar24 + 1;
      iVar5 = p->nObjs;
    } while ((lVar24 < iVar5) && (pGVar12 = p->pObjs + lVar24, p->pObjs != (Gia_Obj_t *)0x0));
  }
  p_00 = Gia_ManStart(iVar5);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p_00->pName = pcVar8;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p_00->pSpec = pcVar8;
  puVar9 = (uint *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pMuxes = puVar9;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar24 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar24];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_007e20d8;
      pGVar12 = p->pObjs;
      if (pGVar12 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar18 = p_00->pObjs;
      if ((pGVar11 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar11)) goto LAB_007e20b9;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar18) >> 2) * -0x55555555);
      pGVar18 = p_00->pObjs;
      if ((pGVar11 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar11)) goto LAB_007e20b9;
      pGVar12[iVar5].Value = (int)((ulong)((long)pGVar11 - (long)pGVar18) >> 2) * 0x55555556;
      lVar24 = lVar24 + 1;
      pVVar10 = p->vCis;
    } while (lVar24 < pVVar10->nSize);
  }
  if (0 < p->nObjs) {
    lVar24 = 0;
    lVar15 = 0;
    local_48 = p_00;
    do {
      pGVar12 = p->pObjs;
      if (pGVar12 == (Gia_Obj_t *)0x0) break;
      if (((~*(uint *)(&pGVar12->field_0x0 + lVar24) & 0x1fffffff) != 0 &&
           -1 < (int)*(uint *)(&pGVar12->field_0x0 + lVar24)) && (p->pRefs[lVar15] != 0)) {
        pGVar18 = (Gia_Obj_t *)(&pGVar12->field_0x0 + lVar24);
        local_50 = lVar15;
        iVar5 = Gia_ObjIsMuxType(pGVar18);
        p_00 = local_48;
        local_58 = pGVar12;
        if (iVar5 == 0) {
          uVar16 = *(ulong *)(&pGVar12->field_0x0 + lVar24);
          uVar6 = *(uint *)((long)pGVar18 + (ulong)(((uint)uVar16 & 0x1fffffff) << 2) * -3 + 8);
          if (((int)uVar6 < 0) ||
             (uVar17 = *(uint *)((long)pGVar12 +
                                lVar24 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3 + 8),
             local_60 = lVar24, (int)uVar17 < 0)) goto LAB_007e20f7;
          pGVar12 = Gia_ManAppendObj(local_48);
          uVar22 = uVar6 >> 1;
          uVar20 = p_00->nObjs;
          if ((int)uVar20 <= (int)uVar22) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar21 = uVar17 >> 1;
          if (uVar20 <= uVar21) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar22 == uVar21) && (p_00->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar6 = (uint)(uVar16 >> 0x1d) & 1 ^ uVar6;
          uVar17 = uVar17 ^ (uint)(uVar16 >> 0x3d) & 1;
          pGVar18 = p_00->pObjs;
          iVar5 = (int)pGVar12;
          if (uVar6 < uVar17) {
            if (pGVar18 + uVar20 <= pGVar12 || pGVar12 < pGVar18) goto LAB_007e20b9;
            uVar16 = *(ulong *)pGVar12;
            uVar13 = (ulong)((uVar6 & 1) << 0x1d |
                            ((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar22 & 0x1fffffff)
            ;
            *(ulong *)pGVar12 = uVar13 | uVar16 & 0xffffffffc0000000;
            pGVar18 = p_00->pObjs;
            if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
            uVar16 = (ulong)(uVar17 & 1) << 0x3d |
                     (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                            ) << 0x20 | uVar13 | uVar16 & 0xc0000000c0000000;
          }
          else {
            if (pGVar18 + uVar20 <= pGVar12 || pGVar12 < pGVar18) goto LAB_007e20b9;
            uVar23 = (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar22 & 0x1fffffff
                            ) << 0x20;
            uVar16 = *(ulong *)pGVar12;
            uVar13 = (ulong)(uVar6 & 1) << 0x3d;
            *(ulong *)pGVar12 = uVar13 | uVar16 & 0xc0000000ffffffff | uVar23;
            pGVar18 = p_00->pObjs;
            if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
            uVar16 = (ulong)((uVar17 & 1) << 0x1d) | uVar13 | uVar16 & 0xc0000000c0000000 | uVar23 |
                     (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                            );
          }
          *(ulong *)pGVar12 = uVar16;
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar12 + -(uVar16 & 0x1fffffff),pGVar12);
            Gia_ObjAddFanout(p_00,pGVar12 + -((ulong)*(uint *)&pGVar12->field_0x4 & 0x1fffffff),
                             pGVar12);
          }
          lVar24 = local_60;
          if (p_00->fSweeper != 0) {
            uVar13 = *(ulong *)pGVar12 & 0x1fffffff;
            uVar16 = *(ulong *)pGVar12 >> 0x20 & 0x1fffffff;
            uVar23 = 0x4000000000000000;
            if (((uint)*(ulong *)(pGVar12 + -uVar13) >> 0x1e & 1) == 0) {
              uVar23 = 0x40000000;
            }
            *(ulong *)(pGVar12 + -uVar13) = uVar23 | *(ulong *)(pGVar12 + -uVar13);
            uVar23 = *(ulong *)(pGVar12 + -uVar16);
            uVar19 = 0x4000000000000000;
            if (((uint)uVar23 >> 0x1e & 1) == 0) {
              uVar19 = 0x40000000;
            }
            *(ulong *)(pGVar12 + -uVar16) = uVar19 | uVar23;
            uVar16 = *(ulong *)pGVar12;
            *(ulong *)pGVar12 =
                 uVar16 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar16 >> 0x3d) ^ (uint)(uVar23 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar12 + -uVar13) >> 0x3f) ^
                        (uint)(uVar16 >> 0x1d) & 7)) << 0x3f;
          }
          if (p_00->fBuiltInSim != 0) {
            uVar16 = *(ulong *)pGVar12;
            *(ulong *)pGVar12 =
                 uVar16 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar16 >> 0x3d) ^
                         (uint)((ulong)*(undefined8 *)(pGVar12 + -(uVar16 >> 0x20 & 0x1fffffff)) >>
                               0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar12 + -(uVar16 & 0x1fffffff)) >> 0x3f) ^
                        (uint)(uVar16 >> 0x1d) & 7)) << 0x3f;
            pGVar18 = p_00->pObjs;
            if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
            Gia_ManBuiltInSimPerform
                      (p_00,(int)((ulong)((long)pGVar12 - (long)pGVar18) >> 2) * -0x55555555);
          }
          if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
            Gia_ManQuantSetSuppAnd(p_00,pGVar12);
          }
          pGVar18 = p_00->pObjs;
          if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
          uVar6 = (int)((ulong)((long)pGVar12 - (long)pGVar18) >> 2) * 0x55555556;
        }
        else {
          iVar5 = Gia_ObjRecognizeExor(pGVar18,&local_70,&local_68);
          p_00 = local_48;
          if (iVar5 == 0) {
            pGVar18 = Gia_ObjRecognizeMux(pGVar18,&local_68,&local_70);
            p_00 = local_48;
            pGVar11 = (Gia_Obj_t *)((ulong)local_70 & 0xfffffffffffffffe);
            pGVar12 = p->pObjs;
            if (pGVar11 < pGVar12) goto LAB_007e20b9;
            uVar17 = p->nObjs;
            pGVar2 = pGVar12 + (int)uVar17;
            if (pGVar2 <= pGVar11) goto LAB_007e20b9;
            uVar6 = (int)((long)pGVar11 - (long)pGVar12 >> 2) * -0x55555555;
            if ((int)uVar6 < 0) goto LAB_007e2116;
            if ((int)uVar17 <= (int)uVar6) goto LAB_007e20d8;
            uVar20 = pGVar12[uVar6 & 0x7fffffff].Value;
            if ((int)uVar20 < 0) goto LAB_007e20f7;
            pGVar11 = (Gia_Obj_t *)((ulong)local_68 & 0xfffffffffffffffe);
            if ((pGVar11 < pGVar12) || (pGVar2 <= pGVar11)) goto LAB_007e20b9;
            uVar6 = (int)((long)pGVar11 - (long)pGVar12 >> 2) * -0x55555555;
            if ((int)uVar6 < 0) goto LAB_007e2116;
            if (uVar17 <= uVar6) goto LAB_007e20d8;
            uVar22 = pGVar12[uVar6 & 0x7fffffff].Value;
            if ((int)uVar22 < 0) goto LAB_007e20f7;
            uVar6 = (uint)local_70 & 1 ^ uVar20;
            uVar21 = (uint)local_68 & 1 ^ uVar22;
            if (uVar6 != uVar21) {
              local_3c = uVar20 >> 1;
              uVar22 = uVar22 >> 1;
              pGVar11 = (Gia_Obj_t *)((ulong)pGVar18 & 0xfffffffffffffffe);
              if (local_3c == uVar22) {
                local_60 = lVar24;
                if (pGVar2 <= pGVar11 || pGVar11 < pGVar12) goto LAB_007e20b9;
                uVar22 = (int)((long)pGVar11 - (long)pGVar12 >> 2) * -0x55555555;
                if ((int)uVar22 < 0) goto LAB_007e2116;
                if (uVar17 <= uVar22) goto LAB_007e20d8;
                uVar17 = pGVar12[uVar22 & 0x7fffffff].Value;
                if ((int)uVar17 < 0) goto LAB_007e20f7;
                uVar20 = Gia_ManAppendXorReal(local_48,uVar20 & 0x7ffffffe,uVar17 & 0x7ffffffe);
                uVar6 = uVar20 ^ (uVar6 ^ (uint)pGVar18 ^ uVar17) & 1;
              }
              else {
                local_60 = lVar24;
                if (pGVar2 <= pGVar11 || pGVar11 < pGVar12) {
LAB_007e20b9:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar20 = (int)((long)pGVar11 - (long)pGVar12 >> 2) * -0x55555555;
                if ((int)uVar20 < 0) goto LAB_007e2116;
                if (uVar17 <= uVar20) goto LAB_007e20d8;
                uVar17 = pGVar12[uVar20 & 0x7fffffff].Value;
                local_38 = pGVar18;
                if ((int)uVar17 < 0) goto LAB_007e20f7;
                pGVar12 = Gia_ManAppendObj(local_48);
                if (p_00->pMuxes == (uint *)0x0) {
                  __assert_fail("p->pMuxes != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2ee,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar20 = p_00->nObjs;
                if ((int)uVar20 <= (int)local_3c) {
                  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2ef,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (uVar20 <= uVar22) {
                  __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar14 = uVar17 >> 1;
                if (uVar20 <= uVar14) {
                  __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (uVar14 == local_3c) {
                  __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (uVar14 == uVar22) {
                  __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar21 = uVar21 & 1;
                if ((uVar21 != 0) && ((p_00->vHTable).nSize != 0)) {
                  __assert_fail("!Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar17 = uVar17 ^ (uint)local_38 & 1;
                pGVar18 = p_00->pObjs;
                iVar5 = (int)pGVar12;
                if (local_3c < uVar22) {
                  if (pGVar18 + uVar20 <= pGVar12 || pGVar12 < pGVar18) goto LAB_007e20b9;
                  uVar16 = *(ulong *)pGVar12;
                  uVar13 = (ulong)((uVar6 & 1) << 0x1d |
                                  ((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - local_3c &
                                  0x1fffffff);
                  *(ulong *)pGVar12 = uVar13 | uVar16 & 0xffffffffc0000000;
                  pGVar18 = p_00->pObjs;
                  if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
                  *(ulong *)pGVar12 =
                       (ulong)uVar21 << 0x3d |
                       (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar22 &
                              0x1fffffff) << 0x20 | uVar13 | uVar16 & 0xc0000000c0000000;
                  pGVar18 = p_00->pObjs;
                  if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
                }
                else {
                  if (pGVar18 + uVar20 <= pGVar12 || pGVar12 < pGVar18) goto LAB_007e20b9;
                  uVar13 = (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - local_3c &
                                  0x1fffffff) << 0x20;
                  uVar16 = *(ulong *)pGVar12;
                  uVar23 = (ulong)(uVar6 & 1) << 0x3d;
                  *(ulong *)pGVar12 = uVar23 | uVar16 & 0xc0000000ffffffff | uVar13;
                  pGVar18 = p_00->pObjs;
                  if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
                  *(ulong *)pGVar12 =
                       (ulong)(uVar21 << 0x1d) | uVar23 | uVar16 & 0xc0000000c0000000 | uVar13 |
                       (ulong)(((uint)(iVar5 - (int)pGVar18) >> 2) * -0x55555555 - uVar22 &
                              0x1fffffff);
                  pGVar18 = p_00->pObjs;
                  if ((pGVar12 < pGVar18) || (pGVar18 + p_00->nObjs <= pGVar12)) goto LAB_007e20b9;
                  uVar17 = uVar17 ^ 1;
                }
                iVar5 = (int)((ulong)((long)pGVar12 - (long)pGVar18) >> 2);
                p_00->pMuxes[iVar5 * -0x55555555] = uVar17;
                p_00->nMuxes = p_00->nMuxes + 1;
                if (pGVar18 + p_00->nObjs <= pGVar12) goto LAB_007e20b9;
                uVar6 = iVar5 * 0x55555556;
                lVar24 = local_60;
              }
            }
          }
          else {
            pGVar18 = (Gia_Obj_t *)((ulong)local_70 & 0xfffffffffffffffe);
            pGVar12 = p->pObjs;
            if (pGVar18 < pGVar12) goto LAB_007e20b9;
            uVar6 = p->nObjs;
            if (pGVar12 + (int)uVar6 <= pGVar18) goto LAB_007e20b9;
            uVar17 = (int)((long)pGVar18 - (long)pGVar12 >> 2) * -0x55555555;
            if ((int)uVar17 < 0) {
LAB_007e2116:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            if ((int)uVar6 <= (int)uVar17) goto LAB_007e20d8;
            uVar17 = pGVar12[uVar17 & 0x7fffffff].Value;
            if ((int)uVar17 < 0) goto LAB_007e20f7;
            pGVar18 = (Gia_Obj_t *)((ulong)local_68 & 0xfffffffffffffffe);
            if ((pGVar18 < pGVar12) || (pGVar12 + (int)uVar6 <= pGVar18)) goto LAB_007e20b9;
            uVar20 = (int)((long)pGVar18 - (long)pGVar12 >> 2) * -0x55555555;
            if ((int)uVar20 < 0) goto LAB_007e2116;
            if (uVar6 <= uVar20) goto LAB_007e20d8;
            uVar20 = pGVar12[uVar20 & 0x7fffffff].Value;
            if ((int)uVar20 < 0) goto LAB_007e20f7;
            uVar22 = (uint)local_70;
            uVar21 = (uint)local_68;
            uVar6 = Gia_ManAppendXorReal(local_48,uVar17 & 0x7ffffffe,uVar20 & 0x7ffffffe);
            uVar6 = uVar6 ^ (uVar21 ^ uVar22 ^ uVar17 ^ uVar20) & 1;
          }
        }
        *(uint *)((long)&local_58->Value + lVar24) = uVar6;
        lVar15 = local_50;
      }
      lVar15 = lVar15 + 1;
      lVar24 = lVar24 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar24 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar24];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_007e20d8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = p->pObjs + iVar5;
      if ((int)pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value < 0) {
LAB_007e20f7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar12 >> 0x1d & 1 ^
                                   pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].
                                   Value);
      pGVar12->Value = uVar6;
      lVar24 = lVar24 + 1;
      pVVar10 = p->vCos;
    } while (lVar24 < pVVar10->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar5 = Gia_ManHasDangling(p_00);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x11b,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxesNoHash( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, iLit0, iLit1, fCompl;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // discount nodes with one fanout pointed to by MUX type
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        Gia_ObjRefDec(p, Gia_ObjFanin0(pObj));
        Gia_ObjRefDec(p, Gia_ObjFanin1(pObj));
    }
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName  = Abc_UtilStrsav( p->pName );
    pNew->pSpec  = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNumId(p, i) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
        {
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
            pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
        }
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            if ( iLit0 == iLit1 )
                pObj->Value = iLit0;
            else if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
            {
                iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC));
                fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
                pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
            }
            else
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling(pNew) );
    return pNew;
}